

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O2

ssize_t __thiscall
pstore::romfs::open_file::read(open_file *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  ulong uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined4 in_register_00000034;
  size_t sVar6;
  long lVar7;
  
  if (__nbytes == 0 || __buf == (void *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar1 = this->pos_;
    uVar2 = (this->dir_->stat_).size;
    pvVar3 = (this->dir_->contents_).ptr_;
    lVar7 = 0;
    sVar5 = 0;
    sVar4 = sVar1;
    while ((sVar6 = __nbytes, __nbytes != sVar5 && (sVar6 = sVar5, sVar4 + (long)__buf <= uVar2))) {
      memcpy((void *)(CONCAT44(in_register_00000034,__fd) + lVar7),
             (void *)((long)pvVar3 + lVar7 + sVar1),(size_t)__buf);
      sVar4 = this->pos_ + (long)__buf;
      this->pos_ = sVar4;
      sVar5 = sVar5 + 1;
      lVar7 = lVar7 + (long)__buf;
    }
  }
  return sVar6;
}

Assistant:

std::size_t open_file::read (not_null<void *> const b, std::size_t const size,
                                     std::size_t const count) {
            if (size == 0 || count == 0) {
                return 0;
            }
            auto const file_size =
                std::make_unsigned<off_t>::type (std::max (dir_.stat ().size, std::size_t{0}));
            auto num_read = std::size_t{0};
            auto const * start =
                reinterpret_cast<std::uint8_t const *> (dir_.contents ().get ()) + pos_;
            void * buffer = b;
            for (; num_read < count; ++num_read) {
                if (pos_ + size > file_size) {
                    return num_read;
                }
                std::memcpy (buffer, start, size);
                start += size;
                buffer = reinterpret_cast<std::uint8_t *> (buffer) + size;
                pos_ += size;
            }
            return num_read;
        }